

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.hpp
# Opt level: O2

void __thiscall
re::fft::fft<float,2048l,(re::fft::direction)1>::butterfly_radix8<2048l>
          (fft<float,2048l,(re::fft::direction)1> *this,span<std::complex<float>,_2048L> out)

{
  long lVar1;
  complex<float> *a;
  complex<float> *b;
  complex<float> *b_00;
  complex<float> *b_01;
  long lVar2;
  complex<float> *a_00;
  complex<float> *a_01;
  complex<float> *a_02;
  complex<float> *b_02;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  for (lVar2 = 1; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    lVar1 = (long)out.storage_.data_ + lVar2 * 8;
    b_02 = (complex<float> *)(lVar1 + 0x800);
    fVar3 = (float)b_02->_M_value;
    fVar4 = (float)(b_02->_M_value >> 0x20);
    fVar5 = (float)*(undefined8 *)(this + lVar2 * 0x20);
    fVar6 = (float)((ulong)*(undefined8 *)(this + lVar2 * 0x20) >> 0x20);
    b_02->_M_value = CONCAT44(fVar3 * fVar6 + fVar5 * fVar4,fVar3 * fVar5 + fVar6 * -fVar4);
    fVar3 = (float)*(undefined8 *)(lVar1 + 0x1000);
    fVar4 = (float)((ulong)*(undefined8 *)(lVar1 + 0x1000) >> 0x20);
    fVar5 = (float)*(undefined8 *)(this + lVar2 * 0x10);
    fVar6 = (float)((ulong)*(undefined8 *)(this + lVar2 * 0x10) >> 0x20);
    *(ulong *)(lVar1 + 0x1000) =
         CONCAT44(fVar3 * fVar6 + fVar5 * fVar4,fVar3 * fVar5 + fVar6 * -fVar4);
    fVar3 = (float)*(undefined8 *)(lVar1 + 0x1800);
    fVar4 = (float)((ulong)*(undefined8 *)(lVar1 + 0x1800) >> 0x20);
    fVar5 = (float)*(undefined8 *)(this + lVar2 * 0x30);
    fVar6 = (float)((ulong)*(undefined8 *)(this + lVar2 * 0x30) >> 0x20);
    *(ulong *)(lVar1 + 0x1800) =
         CONCAT44(fVar3 * fVar6 + fVar5 * fVar4,fVar3 * fVar5 + fVar6 * -fVar4);
    fVar3 = (float)*(undefined8 *)(lVar1 + 0x2000);
    fVar4 = (float)((ulong)*(undefined8 *)(lVar1 + 0x2000) >> 0x20);
    fVar5 = (float)*(undefined8 *)(this + lVar2 * 8);
    fVar6 = (float)((ulong)*(undefined8 *)(this + lVar2 * 8) >> 0x20);
    *(ulong *)(lVar1 + 0x2000) =
         CONCAT44(fVar3 * fVar6 + fVar5 * fVar4,fVar3 * fVar5 + fVar6 * -fVar4);
    fVar3 = (float)*(undefined8 *)(lVar1 + 0x2800);
    fVar4 = (float)((ulong)*(undefined8 *)(lVar1 + 0x2800) >> 0x20);
    fVar5 = (float)*(undefined8 *)(this + lVar2 * 0x28);
    fVar6 = (float)((ulong)*(undefined8 *)(this + lVar2 * 0x28) >> 0x20);
    *(ulong *)(lVar1 + 0x2800) =
         CONCAT44(fVar3 * fVar6 + fVar5 * fVar4,fVar3 * fVar5 + fVar6 * -fVar4);
    fVar3 = (float)*(undefined8 *)(lVar1 + 0x3000);
    fVar4 = (float)((ulong)*(undefined8 *)(lVar1 + 0x3000) >> 0x20);
    fVar5 = (float)*(undefined8 *)(this + lVar2 * 0x18);
    fVar6 = (float)((ulong)*(undefined8 *)(this + lVar2 * 0x18) >> 0x20);
    *(ulong *)(lVar1 + 0x3000) =
         CONCAT44(fVar3 * fVar6 + fVar5 * fVar4,fVar3 * fVar5 + fVar6 * -fVar4);
    fVar3 = (float)*(undefined8 *)(lVar1 + 0x3800);
    fVar4 = (float)((ulong)*(undefined8 *)(lVar1 + 0x3800) >> 0x20);
    fVar5 = (float)*(undefined8 *)(this + lVar2 * 0x38);
    fVar6 = (float)((ulong)*(undefined8 *)(this + lVar2 * 0x38) >> 0x20);
    *(ulong *)(lVar1 + 0x3800) =
         CONCAT44(fVar3 * fVar6 + fVar5 * fVar4,fVar3 * fVar5 + fVar6 * -fVar4);
    a = (complex<float> *)((long)out.storage_.data_ + lVar2 * 8);
    scissors<float>(a,b_02);
    a_00 = (complex<float> *)((long)out.storage_.data_ + lVar2 * 8 + 0x1000);
    b = (complex<float> *)((long)out.storage_.data_ + 0x1800 + lVar2 * 8);
    scissors<float>(a_00,b);
    a_01 = (complex<float> *)((long)out.storage_.data_ + lVar2 * 8 + 0x2000);
    b_00 = (complex<float> *)((long)out.storage_.data_ + 0x2800 + lVar2 * 8);
    scissors<float>(a_01,b_00);
    a_02 = (complex<float> *)((long)out.storage_.data_ + lVar2 * 8 + 0x3000);
    b_01 = (complex<float> *)((long)out.storage_.data_ + 0x3800 + lVar2 * 8);
    scissors<float>(a_02,b_01);
    b->_M_value = CONCAT44((int)b->_M_value,(int)(b->_M_value >> 0x20)) ^ 0x80000000;
    fVar3 = (float)b_00->_M_value;
    fVar4 = (float)(b_00->_M_value >> 0x20);
    fVar5 = (float)*(undefined8 *)(this + 0x800);
    fVar6 = (float)((ulong)*(undefined8 *)(this + 0x800) >> 0x20);
    b_00->_M_value = CONCAT44(fVar3 * fVar6 + fVar5 * fVar4,fVar3 * fVar5 + fVar6 * -fVar4);
    fVar5 = (float)*(undefined8 *)(this + 0x800);
    fVar6 = (float)((ulong)*(undefined8 *)(this + 0x800) >> 0x20);
    fVar3 = (float)b_01->_M_value;
    fVar4 = (float)(b_01->_M_value >> 0x20);
    b_01->_M_value =
         CONCAT44(fVar3 * fVar5 - fVar6 * fVar4,fVar6 * fVar3 + fVar4 * fVar5) ^ 0x80000000;
    scissors<float>(a,a_00);
    scissors<float>(b_02,b);
    scissors<float>(a_01,a_02);
    scissors<float>(b_00,b_01);
    a_02->_M_value = CONCAT44((int)a_02->_M_value,(int)(a_02->_M_value >> 0x20)) ^ 0x80000000;
    b_01->_M_value = CONCAT44((int)b_01->_M_value,(int)(b_01->_M_value >> 0x20)) ^ 0x80000000;
    scissors<float>(a,a_01);
    scissors<float>(b_02,b_00);
    scissors<float>(a_00,a_02);
    scissors<float>(b,b_01);
  }
  return;
}

Assistant:

inline void
    butterfly_radix8(gsl::span <cpx_t, N_out> out) const noexcept
    {
        constexpr auto m = remainder(N_out);
        constexpr auto s = stride(N_out);

        for (auto i = 1; i < m; ++i) {
            if (i > 0) {
                out[i + 1*m] = multiply_fast(out[i + 1*m], twiddles[4*i*s]);
                out[i + 2*m] = multiply_fast(out[i + 2*m], twiddles[2*i*s]);
                out[i + 3*m] = multiply_fast(out[i + 3*m], twiddles[6*i*s]);
                out[i + 4*m] = multiply_fast(out[i + 4*m], twiddles[1*i*s]);
                out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[5*i*s]);
                out[i + 6*m] = multiply_fast(out[i + 6*m], twiddles[3*i*s]);
                out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[7*i*s]);
            }

            scissors(out[i + 0*m], out[i + 1*m]);
            scissors(out[i + 2*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 5*m]);
            scissors(out[i + 6*m], out[i + 7*m]);

            out[i + 3*m] = flip<Direction>(out[i + 3*m]);
            out[i + 5*m] = multiply_fast(out[i + 5*m], twiddles[m]);
            out[i + 7*m] = multiply_fast(out[i + 7*m], twiddles[m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 2*m]);
            scissors(out[i + 1*m], out[i + 3*m]);
            scissors(out[i + 4*m], out[i + 6*m]);
            scissors(out[i + 5*m], out[i + 7*m]);

            out[i + 6*m] = flip<Direction>(out[i + 6*m]);
            out[i + 7*m] = flip<Direction>(out[i + 7*m]);

            scissors(out[i + 0*m], out[i + 4*m]);
            scissors(out[i + 1*m], out[i + 5*m]);
            scissors(out[i + 2*m], out[i + 6*m]);
            scissors(out[i + 3*m], out[i + 7*m]);
        }
    }